

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

StringPtr * __thiscall
kj::Table<unsigned_int,_kj::InsertionOrderIndex>::insert
          (Table<unsigned_int,_kj::InsertionOrderIndex> *this,StringPtr *row)

{
  StringPtr *pSVar1;
  StringPtr *pSVar2;
  size_t newSize;
  InsertionOrderIndex local_28;
  
  InsertionOrderIndex::insertImpl(&local_28,(size_t)&this->indexes);
  if ((char)local_28.capacity != '\x01') {
    pSVar2 = (this->rows).builder.pos;
    if (pSVar2 == (this->rows).builder.endPtr) {
      pSVar1 = (this->rows).builder.ptr;
      newSize = 4;
      if (pSVar2 != pSVar1) {
        newSize = (long)pSVar2 - (long)pSVar1 >> 1;
      }
      Vector<unsigned_int>::setCapacity((Vector<unsigned_int> *)this,newSize);
      pSVar2 = (this->rows).builder.pos;
    }
    *(undefined4 *)&(pSVar2->content).ptr = *(undefined4 *)&(row->content).ptr;
    (this->rows).builder.pos = (RemoveConst<kj::StringPtr> *)((long)&(pSVar2->content).ptr + 4);
    return pSVar2;
  }
  _::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  KJ_IF_MAYBE(existing, Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }